

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O1

double __thiscall
icu_63::NFRule::matchToDelimiter
          (NFRule *this,UnicodeString *text,int32_t startPos,double _baseValue,
          UnicodeString *delimiter,ParsePosition *pp,NFSubstitution *sub,
          uint32_t nonNumericalExecutedRuleMask,double upperBound)

{
  UBool UVar1;
  int iVar2;
  int32_t srcLength;
  undefined4 uVar3;
  int32_t iVar4;
  UnicodeString *this_00;
  bool bVar5;
  UObject *extraout_XMM0_Qa;
  int32_t dLen;
  ParsePosition tempPP_1;
  UErrorCode status;
  ParsePosition tempPP;
  Formattable result;
  UObject *local_130;
  int local_124;
  ParsePosition *local_120;
  undefined1 local_118 [56];
  UnicodeString local_e0;
  Formattable local_a0;
  
  local_118._28_4_ = 0;
  local_120 = pp;
  local_118._16_8_ = _baseValue;
  local_118._32_8_ = upperBound;
  UVar1 = allIgnorable(this,delimiter,(UErrorCode *)(local_118 + 0x1c));
  if (UVar1 == '\0') {
    if (0 < (int)local_118._28_4_) {
      return 0.0;
    }
    local_118._0_8_ = &PTR__ParsePosition_00480ff8;
    local_118._8_8_ = 0xffffffff00000000;
    Formattable::Formattable(&local_a0);
    local_118._40_8_ = delimiter;
    srcLength = findText(this,text,delimiter,startPos,&local_124);
    local_118._48_8_ = &PTR__UnicodeString_0048be70;
    local_130 = extraout_XMM0_Qa;
    do {
      if (srcLength < 0) {
        local_120->index = 0;
        local_130 = (UObject *)0x0;
        break;
      }
      local_e0.super_Replaceable.super_UObject._vptr_UObject = (UObject)(UObject)local_118._48_8_;
      local_e0.fUnion.fStackFields.fLengthAndFlags = 2;
      icu_63::UnicodeString::unBogus(&local_e0);
      if ((short)local_e0.fUnion._0_2_ < 0) {
        uVar3 = local_e0.fUnion.fFields.fLength;
      }
      else {
        uVar3 = (int)local_e0.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      icu_63::UnicodeString::doReplace(&local_e0,0,uVar3,text,0,srcLength);
      if ((short)local_e0.fUnion._0_2_ < 0) {
        uVar3 = local_e0.fUnion.fFields.fLength;
      }
      else {
        uVar3 = (int)local_e0.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if ((int)uVar3 < 1) {
LAB_002f4024:
        local_118._8_8_ = local_118._8_8_ & 0xffffffff00000000;
        srcLength = findText(this,text,(UnicodeString *)local_118._40_8_,srcLength + local_124,
                             &local_124);
        bVar5 = true;
      }
      else {
        iVar2 = (*(this->formatter->super_NumberFormat).super_Format.super_UObject._vptr_UObject
                  [0x19])();
        iVar2 = (*(sub->super_UObject)._vptr_UObject[10])
                          (local_118._16_8_,local_118._32_8_,sub,&local_e0,local_118,
                           (ulong)(uint)(int)(char)iVar2,(ulong)nonNumericalExecutedRuleMask,
                           &local_a0);
        bVar5 = (char)iVar2 != '\0';
        if (local_118._8_4_ == srcLength && bVar5) {
          local_120->index = local_124 + srcLength;
          local_130 = local_a0.fValue.fObject;
        }
        else {
          iVar4 = local_118._12_4_;
          if ((int)local_118._12_4_ < 1) {
            iVar4 = local_118._8_4_;
          }
          local_120->errorIndex = iVar4;
        }
        if (local_118._8_4_ != srcLength || !bVar5) goto LAB_002f4024;
        bVar5 = false;
      }
      icu_63::UnicodeString::~UnicodeString(&local_e0);
    } while (bVar5);
    Formattable::~Formattable(&local_a0);
    this_00 = (UnicodeString *)local_118;
  }
  else {
    if (sub == (NFSubstitution *)0x0) {
      return (double)local_118._16_8_;
    }
    local_e0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__ParsePosition_00480ff8;
    local_e0.fUnion._0_8_ = 0xffffffff00000000;
    Formattable::Formattable(&local_a0);
    iVar2 = (*(this->formatter->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x19])
                      ();
    iVar2 = (*(sub->super_UObject)._vptr_UObject[10])
                      (local_118._16_8_,local_118._32_8_,sub,text,&local_e0,
                       (ulong)(uint)(int)(char)iVar2,(ulong)nonNumericalExecutedRuleMask,&local_a0);
    if (((char)iVar2 == '\0') || (local_e0.fUnion._0_4_ == 0)) {
      local_120->errorIndex = local_e0.fUnion.fFields.fLength;
      local_130 = (UObject *)0x0;
    }
    else {
      local_120->index = local_e0.fUnion._0_4_;
      local_130 = local_a0.fValue.fObject;
    }
    Formattable::~Formattable(&local_a0);
    this_00 = &local_e0;
  }
  ParsePosition::~ParsePosition((ParsePosition *)this_00);
  return (double)local_130;
}

Assistant:

double
NFRule::matchToDelimiter(const UnicodeString& text,
                         int32_t startPos,
                         double _baseValue,
                         const UnicodeString& delimiter,
                         ParsePosition& pp,
                         const NFSubstitution* sub,
                         uint32_t nonNumericalExecutedRuleMask,
                         double upperBound) const
{
	UErrorCode status = U_ZERO_ERROR;
    // if "delimiter" contains real (i.e., non-ignorable) text, search
    // it for "delimiter" beginning at "start".  If that succeeds, then
    // use "sub"'s doParse() method to match the text before the
    // instance of "delimiter" we just found.
    if (!allIgnorable(delimiter, status)) {
    	if (U_FAILURE(status)) { //Memory allocation error.
    		return 0;
    	}
        ParsePosition tempPP;
        Formattable result;

        // use findText() to search for "delimiter".  It returns a two-
        // element array: element 0 is the position of the match, and
        // element 1 is the number of characters that matched
        // "delimiter".
        int32_t dLen;
        int32_t dPos = findText(text, delimiter, startPos, &dLen);

        // if findText() succeeded, isolate the text preceding the
        // match, and use "sub" to match that text
        while (dPos >= 0) {
            UnicodeString subText;
            subText.setTo(text, 0, dPos);
            if (subText.length() > 0) {
                UBool success = sub->doParse(subText, tempPP, _baseValue, upperBound,
#if UCONFIG_NO_COLLATION
                    FALSE,
#else
                    formatter->isLenient(),
#endif
                    nonNumericalExecutedRuleMask,
                    result);

                // if the substitution could match all the text up to
                // where we found "delimiter", then this function has
                // a successful match.  Bump the caller's parse position
                // to point to the first character after the text
                // that matches "delimiter", and return the result
                // we got from parsing the substitution.
                if (success && tempPP.getIndex() == dPos) {
                    pp.setIndex(dPos + dLen);
                    return result.getDouble();
                }
                else {
                    // commented out because ParsePosition doesn't have error index in 1.1.x
                    // restored for ICU4C port
                    if (tempPP.getErrorIndex() > 0) {
                        pp.setErrorIndex(tempPP.getErrorIndex());
                    } else {
                        pp.setErrorIndex(tempPP.getIndex());
                    }
                }
            }

            // if we didn't match the substitution, search for another
            // copy of "delimiter" in "text" and repeat the loop if
            // we find it
            tempPP.setIndex(0);
            dPos = findText(text, delimiter, dPos + dLen, &dLen);
        }
        // if we make it here, this was an unsuccessful match, and we
        // leave pp unchanged and return 0
        pp.setIndex(0);
        return 0;

        // if "delimiter" is empty, or consists only of ignorable characters
        // (i.e., is semantically empty), thwe we obviously can't search
        // for "delimiter".  Instead, just use "sub" to parse as much of
        // "text" as possible.
    }
    else if (sub == NULL) {
        return _baseValue;
    }
    else {
        ParsePosition tempPP;
        Formattable result;

        // try to match the whole string against the substitution
        UBool success = sub->doParse(text, tempPP, _baseValue, upperBound,
#if UCONFIG_NO_COLLATION
            FALSE,
#else
            formatter->isLenient(),
#endif
            nonNumericalExecutedRuleMask,
            result);
        if (success && (tempPP.getIndex() != 0)) {
            // if there's a successful match (or it's a null
            // substitution), update pp to point to the first
            // character we didn't match, and pass the result from
            // sub.doParse() on through to the caller
            pp.setIndex(tempPP.getIndex());
            return result.getDouble();
        }
        else {
            // commented out because ParsePosition doesn't have error index in 1.1.x
            // restored for ICU4C port
            pp.setErrorIndex(tempPP.getErrorIndex());
        }

        // and if we get to here, then nothing matched, so we return
        // 0 and leave pp alone
        return 0;
    }
}